

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mapper004.cpp
# Opt level: O0

void __thiscall Mapper004::switchBanks(Mapper004 *this)

{
  uint32_t uVar1;
  Mapper004 *in_RDI;
  
  if (in_RDI->rommode == '\0') {
    uVar1 = calcRBankOffset(in_RDI,in_RDI->regs[6]);
    in_RDI->ROMBanks[0] = uVar1;
    uVar1 = calcRBankOffset(in_RDI,in_RDI->regs[7]);
    in_RDI->ROMBanks[1] = uVar1;
    uVar1 = calcRBankOffset(in_RDI,0xfe);
    in_RDI->ROMBanks[2] = uVar1;
    uVar1 = calcRBankOffset(in_RDI,0xff);
    in_RDI->ROMBanks[3] = uVar1;
  }
  else if (in_RDI->rommode == '\x01') {
    uVar1 = calcRBankOffset(in_RDI,0xfe);
    in_RDI->ROMBanks[0] = uVar1;
    uVar1 = calcRBankOffset(in_RDI,in_RDI->regs[7]);
    in_RDI->ROMBanks[1] = uVar1;
    uVar1 = calcRBankOffset(in_RDI,in_RDI->regs[6]);
    in_RDI->ROMBanks[2] = uVar1;
    uVar1 = calcRBankOffset(in_RDI,0xff);
    in_RDI->ROMBanks[3] = uVar1;
  }
  if (in_RDI->vrommode == '\0') {
    uVar1 = calcVBankOffset(in_RDI,in_RDI->regs[0] & 0xfe);
    in_RDI->VROMBanks[0] = uVar1;
    uVar1 = calcVBankOffset(in_RDI,in_RDI->regs[0] | 1);
    in_RDI->VROMBanks[1] = uVar1;
    uVar1 = calcVBankOffset(in_RDI,in_RDI->regs[1] & 0xfe);
    in_RDI->VROMBanks[2] = uVar1;
    uVar1 = calcVBankOffset(in_RDI,in_RDI->regs[1] | 1);
    in_RDI->VROMBanks[3] = uVar1;
    uVar1 = calcVBankOffset(in_RDI,in_RDI->regs[2]);
    in_RDI->VROMBanks[4] = uVar1;
    uVar1 = calcVBankOffset(in_RDI,in_RDI->regs[3]);
    in_RDI->VROMBanks[5] = uVar1;
    uVar1 = calcVBankOffset(in_RDI,in_RDI->regs[4]);
    in_RDI->VROMBanks[6] = uVar1;
    uVar1 = calcVBankOffset(in_RDI,in_RDI->regs[5]);
    in_RDI->VROMBanks[7] = uVar1;
  }
  else if (in_RDI->vrommode == '\x01') {
    uVar1 = calcVBankOffset(in_RDI,in_RDI->regs[2]);
    in_RDI->VROMBanks[0] = uVar1;
    uVar1 = calcVBankOffset(in_RDI,in_RDI->regs[3]);
    in_RDI->VROMBanks[1] = uVar1;
    uVar1 = calcVBankOffset(in_RDI,in_RDI->regs[4]);
    in_RDI->VROMBanks[2] = uVar1;
    uVar1 = calcVBankOffset(in_RDI,in_RDI->regs[5]);
    in_RDI->VROMBanks[3] = uVar1;
    uVar1 = calcVBankOffset(in_RDI,in_RDI->regs[0] & 0xfe);
    in_RDI->VROMBanks[4] = uVar1;
    uVar1 = calcVBankOffset(in_RDI,in_RDI->regs[0] | 1);
    in_RDI->VROMBanks[5] = uVar1;
    uVar1 = calcVBankOffset(in_RDI,in_RDI->regs[1] & 0xfe);
    in_RDI->VROMBanks[6] = uVar1;
    uVar1 = calcVBankOffset(in_RDI,in_RDI->regs[1] | 1);
    in_RDI->VROMBanks[7] = uVar1;
  }
  return;
}

Assistant:

void Mapper004::switchBanks() {
    if (rommode == 0) {
        ROMBanks[0] = calcRBankOffset(regs[6]);
        ROMBanks[1] = calcRBankOffset(regs[7]);
        ROMBanks[2] = calcRBankOffset(-2);
        ROMBanks[3] = calcRBankOffset(-1);
    } else if (rommode == 1) {
        ROMBanks[0] = calcRBankOffset(-2);
        ROMBanks[1] = calcRBankOffset(regs[7]);
        ROMBanks[2] = calcRBankOffset(regs[6]);
        ROMBanks[3] = calcRBankOffset(-1);
    }

    if (vrommode == 0) {
        VROMBanks[0] = calcVBankOffset(regs[0] & 0xFE);
        VROMBanks[1] = calcVBankOffset(regs[0] | 0x01);
        VROMBanks[2] = calcVBankOffset(regs[1] & 0xFE);
        VROMBanks[3] = calcVBankOffset(regs[1] | 0x01);
        VROMBanks[4] = calcVBankOffset(regs[2]);
        VROMBanks[5] = calcVBankOffset(regs[3]);
        VROMBanks[6] = calcVBankOffset(regs[4]);
        VROMBanks[7] = calcVBankOffset(regs[5]);
    } else if (vrommode == 1) {
        VROMBanks[0] = calcVBankOffset(regs[2]);
        VROMBanks[1] = calcVBankOffset(regs[3]);
        VROMBanks[2] = calcVBankOffset(regs[4]);
        VROMBanks[3] = calcVBankOffset(regs[5]);
        VROMBanks[4] = calcVBankOffset(regs[0] & 0xFE);
        VROMBanks[5] = calcVBankOffset(regs[0] | 0x01);
        VROMBanks[6] = calcVBankOffset(regs[1] & 0xFE);
        VROMBanks[7] = calcVBankOffset(regs[1] | 0x01);
    }
}